

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O1

void writePic<PicHeaderSwitch>(ostream *stream,PicHeader *header,istream *reference)

{
  pointer pPVar1;
  PicChunk *chunk;
  pointer pPVar2;
  PicHeaderSwitch t;
  undefined4 local_4c;
  undefined8 local_48;
  undefined1 local_40 [4];
  uint local_3c;
  uint32_t local_38;
  undefined8 local_34;
  int local_28;
  
  std::istream::seekg((long)reference,_S_beg);
  std::istream::read((char *)reference,(long)local_40);
  local_38 = header->filesize;
  local_34._0_2_ = header->ew;
  local_34._2_2_ = header->eh;
  local_34._4_2_ = header->width;
  local_34._6_2_ = header->height;
  local_28 = (int)((ulong)((long)(header->chunks).
                                 super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(header->chunks).
                                super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2) * -0x55555555;
  std::ostream::write((char *)stream,(long)local_40);
  copyBytes(stream,reference,(uint)(2 < local_3c) << 2);
  pPVar2 = (header->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (header->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar2 != pPVar1) {
    do {
      local_4c._0_2_ = pPVar2->x;
      local_4c._2_2_ = pPVar2->y;
      local_48._0_4_ = pPVar2->offset;
      local_48._4_4_ = pPVar2->size;
      std::ostream::write((char *)stream,(long)&local_4c);
      pPVar2 = pPVar2 + 1;
    } while (pPVar2 != pPVar1);
  }
  return;
}

Assistant:

void writePic(std::ostream& stream, const PicHeader& header, std::istream& reference) {
	reference.seekg(0, reference.beg);
	Header h = readRaw<Header>(reference);
	h.filesize = header.filesize;
	h.ew = header.ew;
	h.eh = header.eh;
	h.width = header.width;
	h.height = header.height;
	h.chunks = header.chunks.size();
	writeRaw(stream, h);
	copyBytes(stream, reference, h.bytesToSkip());
	for (const auto& chunk : header.chunks) {
		typename Header::Chunk c(chunk.x, chunk.y, chunk.offset, chunk.size);
		writeRaw(stream, c);
	}
}